

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void __thiscall capnp::_::PointerBuilder::setBlob<capnp::Text>(PointerBuilder *this,Reader value)

{
  SegmentBuilder *segment;
  ulong __n;
  SegmentWordCount unaff_EBP;
  char *pcVar1;
  WirePointer *pWVar2;
  BuilderArena *unaff_R12;
  uint uVar3;
  char *unaff_R14;
  WirePointer *unaff_R15;
  AllocateResult AVar4;
  anon_class_1_0_00000001 local_31;
  
  pcVar1 = value.super_StringPtr.content.ptr;
  __n = value.super_StringPtr.content.size_ - 1;
  if (__n < 0x1fffffff) {
    unaff_R15 = this->pointer;
    segment = this->segment;
    uVar3 = (int)__n + 8U >> 3;
    if ((unaff_R15->field_1).upper32Bits != 0 || (unaff_R15->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(segment,this->capTable,unaff_R15);
    }
    pWVar2 = (WirePointer *)segment->pos;
    if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
              ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar2)) >> 3 <
        (long)(ulong)uVar3) {
      pWVar2 = (WirePointer *)0x0;
    }
    else {
      segment->pos = (word *)(pWVar2 + uVar3);
    }
    unaff_R14 = pcVar1;
    if (pWVar2 != (WirePointer *)0x0) {
      (unaff_R15->offsetAndKind).value =
           ((uint)((ulong)((long)pWVar2 - (long)unaff_R15) >> 1) & 0xfffffffc) - 3;
      goto LAB_0018e828;
    }
    unaff_EBP = uVar3 + 1;
    unaff_R12 = (BuilderArena *)(segment->super_SegmentReader).arena;
    pWVar2 = unaff_R15;
    if (uVar3 == 0x1fffffff) goto LAB_0018e857;
  }
  else {
    WireHelpers::setTextPointer::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this);
LAB_0018e857:
    WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_31);
    pWVar2 = unaff_R15;
  }
  AVar4 = BuilderArena::allocate(unaff_R12,unaff_EBP);
  unaff_R15 = (WirePointer *)AVar4.words;
  (pWVar2->offsetAndKind).value =
       (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
  pWVar2->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)((AVar4.segment)->super_SegmentReader).id.value;
  (unaff_R15->offsetAndKind).value = 1;
  pWVar2 = unaff_R15 + 1;
LAB_0018e828:
  (unaff_R15->field_1).upper32Bits = (int)__n * 8 + 10;
  if (__n != 0) {
    memcpy(pWVar2,unaff_R14,__n);
  }
  return;
}

Assistant:

void PointerBuilder::setBlob<Text>(Text::Reader value) {
  WireHelpers::setTextPointer(pointer, segment, capTable, value);
}